

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JSONStack.cpp
# Opt level: O2

bool __thiscall JSON::JSONStack::Push(JSONStack *this,Var data,bool bJsObject)

{
  bool bVar1;
  undefined3 in_register_00000011;
  Var local_28;
  Var data_local;
  
  local_28 = data;
  if (CONCAT31(in_register_00000011,bJsObject) == 0) {
    EnsuresDomObjectStack(this);
    if (this->tempValues[1] != (Var)0x0) {
      JsUtil::
      List<void_*,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_SpecializedComparer<void_*,_JSON::StrictEqualsObjectComparer>::TComparerType>
      ::Add(this->domObjectStack,this->tempValues + 1);
      this->tempValues[1] = (Var)0x0;
    }
    if ((this->domObjectStack->
        super_ReadOnlyList<void_*,_Memory::ArenaAllocator,_SpecializedComparer<void_*,_JSON::StrictEqualsObjectComparer>::TComparerType>
        ).count == 0) {
      this->tempValues[1] = data;
    }
    else {
      JsUtil::
      List<void_*,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_SpecializedComparer<void_*,_JSON::StrictEqualsObjectComparer>::TComparerType>
      ::Add(this->domObjectStack,&local_28);
    }
  }
  else {
    if (this->tempValues[0] != (Var)0x0) {
      SList<void_*,_Memory::ArenaAllocator,_RealCount>::Prepend
                (&this->jsObjectStack,this->tempValues);
      this->tempValues[0] = (Var)0x0;
    }
    if ((this->jsObjectStack).super_SListBase<void_*,_Memory::ArenaAllocator,_RealCount>.
        super_RealCount.count != 0) {
      bVar1 = SList<void_*,_Memory::ArenaAllocator,_RealCount>::Prepend
                        (&this->jsObjectStack,&local_28);
      return bVar1;
    }
    this->tempValues[0] = data;
  }
  return true;
}

Assistant:

bool JSONStack::Push(Js::Var data, bool bJsObject)
    {
        if (bJsObject)
        {
            bool result = true;
            if (_JS_VALUE)
            {
                jsObjectStack.Push(_JS_VALUE);
                _JS_VALUE = nullptr;
            }

            if (jsObjectStack.Count())
            {
                result = jsObjectStack.Push(data);
            }
            else
            {
                _JS_VALUE = data;
            }

            return result;
        }

        EnsuresDomObjectStack();

        if (_DOM_VALUE)
        {
            domObjectStack->Add(_DOM_VALUE);
            _DOM_VALUE = nullptr;
        }

        if (domObjectStack->Count())
        {
            domObjectStack->Add(data);
        }
        else
        {
            _DOM_VALUE = data;
        }
        return true;
    }